

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  byte *pbVar1;
  ulong uVar2;
  handle hVar3;
  handle hVar4;
  handle hVar5;
  _Alloc_hider _Var6;
  int iVar7;
  internals *this_00;
  type_info *ptVar8;
  object *poVar9;
  long *plVar10;
  PyTypeObject *pPVar11;
  long lVar12;
  size_t sVar13;
  char *__dest;
  undefined8 *puVar14;
  mapped_type *pmVar15;
  mapped_type *ppvVar16;
  mapped_type *ppvVar17;
  char *pcVar18;
  PyObject *pPVar19;
  key_type *pkVar20;
  size_type *psVar21;
  object name;
  object ht_qualname;
  object scope_module;
  string full_name;
  string meta_name_;
  tuple bases;
  object metaclass;
  object ht_qualname_meta;
  object scope_qualname;
  object meta_name;
  object type_holder;
  type_index tindex;
  handle local_190;
  handle local_188;
  handle local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [23];
  allocator local_151;
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  handle local_130;
  handle local_128;
  handle local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  generic_type *local_f8;
  handle local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  handle local_c8;
  object local_c0;
  string local_b8;
  key_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_f8 = this;
  this_00 = get_internals();
  local_98._M_target = rec->type;
  ptVar8 = get_type_info(local_98._M_target,false);
  if (ptVar8 != (type_info *)0x0) {
    std::__cxx11::string::string((string *)&local_b8,rec->name,(allocator *)local_150);
    std::operator+(&local_118,"generic_type: type \"",&local_b8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_178._0_8_ = *plVar10;
    pPVar19 = (PyObject *)(plVar10 + 2);
    if ((PyObject *)local_178._0_8_ == pPVar19) {
      local_168._0_8_ = pPVar19->ob_refcnt;
      local_168._8_8_ = plVar10[3];
      local_178._0_8_ = (PyObject *)local_168;
    }
    else {
      local_168._0_8_ = pPVar19->ob_refcnt;
    }
    local_178._8_8_ = plVar10[1];
    *plVar10 = (long)pPVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    pybind11_fail((string *)local_178);
  }
  local_190.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  local_180.m_ptr = (PyObject *)0x0;
  pPVar19 = (rec->scope).m_ptr;
  if (pPVar19 != (PyObject *)0x0) {
    iVar7 = PyObject_HasAttrString(pPVar19,rec->name);
    if (iVar7 == 1) {
      std::__cxx11::string::string((string *)&local_b8,rec->name,(allocator *)local_150);
      std::operator+(&local_118,"generic_type: cannot initialize type \"",&local_b8);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_178._0_8_ = *plVar10;
      pPVar19 = (PyObject *)(plVar10 + 2);
      if ((PyObject *)local_178._0_8_ == pPVar19) {
        local_168._0_8_ = pPVar19->ob_refcnt;
        local_168._8_8_ = plVar10[3];
        local_178._0_8_ = (PyObject *)local_168;
      }
      else {
        local_168._0_8_ = pPVar19->ob_refcnt;
      }
      local_178._8_8_ = plVar10[1];
      *plVar10 = (long)pPVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pybind11_fail((string *)local_178);
    }
    iVar7 = PyObject_HasAttrString((rec->scope).m_ptr,"__module__");
    if (iVar7 == 1) {
      local_178._8_8_ = (rec->scope).m_ptr;
      local_168._0_8_ = "__module__";
      local_168._8_8_ = (PyObject *)0x0;
      poVar9 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_178);
    }
    else {
      iVar7 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar7 != 1) goto LAB_00113dc1;
      local_178._8_8_ = (rec->scope).m_ptr;
      local_168._0_8_ = "__name__";
      local_168._8_8_ = (PyObject *)0x0;
      poVar9 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_178);
    }
    local_118._M_dataplus._M_p = (pointer)(poVar9->super_handle).m_ptr;
    if ((PyObject *)local_118._M_dataplus._M_p != (PyObject *)0x0) {
      ((PyObject *)local_118._M_dataplus._M_p)->ob_refcnt =
           ((PyObject *)local_118._M_dataplus._M_p)->ob_refcnt + 1;
    }
    object::operator=((object *)&local_180,(object *)&local_118);
    object::~object((object *)&local_118);
    object::~object((object *)(local_168 + 8));
  }
LAB_00113dc1:
  local_f0.m_ptr = (PyObject *)0x0;
  pPVar19 = (rec->scope).m_ptr;
  if ((pPVar19 != (PyObject *)0x0) &&
     (iVar7 = PyObject_HasAttrString(pPVar19,"__qualname__"), iVar7 == 1)) {
    local_178._8_8_ = (rec->scope).m_ptr;
    local_168._0_8_ = "__qualname__";
    local_168._8_8_ = (PyObject *)0x0;
    poVar9 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                       ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_178);
    local_118._M_dataplus._M_p = (pointer)(poVar9->super_handle).m_ptr;
    if ((PyObject *)local_118._M_dataplus._M_p != (PyObject *)0x0) {
      ((PyObject *)local_118._M_dataplus._M_p)->ob_refcnt =
           ((PyObject *)local_118._M_dataplus._M_p)->ob_refcnt + 1;
    }
    object::operator=((object *)&local_f0,(object *)&local_118);
    object::~object((object *)&local_118);
    object::~object((object *)(local_168 + 8));
  }
  local_188.m_ptr = (PyObject *)0x0;
  local_120.m_ptr = (PyObject *)0x0;
  if (local_f0.m_ptr == (PyObject *)0x0) {
    object::operator=((object *)&local_188,(object *)&local_190);
  }
  else {
    local_178._0_8_ = PyUnicode_FromFormat("%U.%U",local_f0.m_ptr,local_190.m_ptr);
    object::operator=((object *)&local_188,(object *)local_178);
    object::~object((object *)local_178);
  }
  if ((rec->field_0x48 & 8) != 0) {
    local_178._0_8_ = PyUnicode_FromFormat("%U__Meta",local_188.m_ptr);
    object::operator=((object *)&local_120,(object *)local_178);
    object::~object((object *)local_178);
  }
  hVar3.m_ptr = local_180.m_ptr;
  if (local_180.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)local_178,rec->name,(allocator *)&local_118);
  }
  else {
    str::str((str *)&local_c0,(object *)&local_180);
    str::operator_cast_to_string(&local_b8,(str *)&local_c0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    pPVar19 = (PyObject *)(plVar10 + 2);
    if ((PyObject *)*plVar10 == pPVar19) {
      local_118.field_2._M_allocated_capacity = pPVar19->ob_refcnt;
      local_118.field_2._8_8_ = plVar10[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = pPVar19->ob_refcnt;
      local_118._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_118._M_string_length = plVar10[1];
    *plVar10 = (long)pPVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_178._0_8_ = local_168;
    pPVar19 = (PyObject *)(plVar10 + 2);
    if ((PyObject *)*plVar10 == pPVar19) {
      local_168._0_8_ = pPVar19->ob_refcnt;
      local_168._8_8_ = plVar10[3];
    }
    else {
      local_168._0_8_ = pPVar19->ob_refcnt;
      local_178._0_8_ = (PyObject *)*plVar10;
    }
    local_178._8_8_ = plVar10[1];
    *plVar10 = (long)pPVar19;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
  }
  if (hVar3.m_ptr != (PyObject *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    object::~object(&local_c0);
  }
  local_128.m_ptr = (PyObject *)0x0;
  if ((rec->field_0x48 & 8) != 0) {
    local_150._0_8_ = local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_150,local_178._0_8_,
               (char *)(local_178._0_8_ + (long)(Py_ssize_t *)local_178._8_8_));
    std::__cxx11::string::append(local_150);
    local_e8._M_dataplus._M_p = (pointer)PyUnicode_FromString(local_150._0_8_);
    local_90._M_dataplus._M_p = (pointer)(*_PyDict_GetItem)(&PyType_Type,0);
    object::operator=((object *)&local_128,(object *)&local_90);
    object::~object((object *)&local_90);
    _Var6._M_p = local_e8._M_dataplus._M_p;
    hVar4.m_ptr = local_120.m_ptr;
    hVar3.m_ptr = local_128.m_ptr;
    if (((PyTypeObject *)local_128.m_ptr == (PyTypeObject *)0x0) ||
       (local_190.m_ptr == (PyObject *)0x0)) {
      pybind11_fail("generic_type::generic_type(): unable to create metaclass!");
    }
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_128.m_ptr[0x35].ob_refcnt = (Py_ssize_t)_Var6._M_p;
    local_120.m_ptr = (PyObject *)0x0;
    local_128.m_ptr[0x36].ob_refcnt = (Py_ssize_t)hVar4.m_ptr;
    pPVar11 = (PyTypeObject *)strdup((char *)local_150._0_8_);
    hVar3.m_ptr[1].ob_type = pPVar11;
    hVar3.m_ptr[0x10].ob_refcnt = (Py_ssize_t)&PyType_Type;
    pbVar1 = (byte *)((long)&hVar3.m_ptr[10].ob_type + 1);
    *pbVar1 = *pbVar1 | 2;
    iVar7 = PyType_Ready(hVar3.m_ptr);
    if (iVar7 < 0) {
      pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
    }
    object::~object((object *)&local_e8);
    if ((undefined1 *)local_150._0_8_ != local_140) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_140._0_8_ + 1));
    }
  }
  lVar12 = PyList_Size((rec->bases).super_object.super_handle.m_ptr);
  tuple::tuple((tuple *)&local_130,&(rec->bases).super_object);
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (char *)0x0;
  }
  else {
    sVar13 = strlen(rec->doc);
    __dest = (char *)PyObject_Malloc(sVar13 + 1);
    memcpy(__dest,rec->doc,sVar13 + 1);
  }
  pPVar11 = (PyTypeObject *)(*_PyDict_GetItem)(&PyType_Type,0);
  local_c8.m_ptr = (PyObject *)pPVar11;
  if ((pPVar11 != (PyTypeObject *)0x0) && (local_190.m_ptr != (PyObject *)0x0)) {
    puVar14 = (undefined8 *)operator_new(0x68);
    *puVar14 = 0;
    puVar14[1] = 0;
    puVar14[10] = 0;
    puVar14[0xb] = 0;
    puVar14[8] = 0;
    puVar14[9] = 0;
    puVar14[6] = 0;
    puVar14[7] = 0;
    puVar14[4] = 0;
    puVar14[5] = 0;
    puVar14[2] = 0;
    puVar14[3] = 0;
    puVar14[0xc] = 0;
    *(undefined1 *)(puVar14 + 0xc) = 1;
    *puVar14 = pPVar11;
    puVar14[1] = rec->type_size;
    puVar14[2] = rec->init_holder;
    pmVar15 = std::__detail::
              _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this_00->direct_conversions,&local_98);
    puVar14[9] = pmVar15;
    ppvVar16 = std::__detail::
               _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_98);
    *ppvVar16 = puVar14;
    local_150._0_8_ = pPVar11;
    ppvVar17 = std::__detail::
               _Map_base<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this_00->registered_types_py,(key_type *)local_150);
    *ppvVar17 = puVar14;
    pcVar18 = strdup((char *)local_178._0_8_);
    pPVar11->tp_name = pcVar18;
    pPVar11->tp_basicsize = rec->instance_size;
    if (lVar12 != 0) {
      local_150._8_8_ = local_130.m_ptr;
      local_140._0_8_ = (PyObject *)0x0;
      local_140._8_8_ = (PyObject *)0x0;
      poVar9 = accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_150);
      local_e8._M_dataplus._M_p = (pointer)(poVar9->super_handle).m_ptr;
      if ((_typeobject *)local_e8._M_dataplus._M_p != (_typeobject *)0x0) {
        (((_typeobject *)local_e8._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
             (((_typeobject *)local_e8._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
        (((_typeobject *)local_e8._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
             (((_typeobject *)local_e8._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
      }
      pPVar11->tp_base = (_typeobject *)local_e8._M_dataplus._M_p;
      object::~object((object *)&local_e8);
      object::~object((object *)(local_140 + 8));
      hVar3.m_ptr = local_130.m_ptr;
      local_130.m_ptr = (PyObject *)0x0;
      pPVar11->tp_bases = hVar3.m_ptr;
      rec->field_0x48 = rec->field_0x48 | lVar12 != 1;
    }
    hVar5.m_ptr = local_128.m_ptr;
    hVar4.m_ptr = local_188.m_ptr;
    hVar3.m_ptr = local_190.m_ptr;
    local_190.m_ptr = (PyObject *)0x0;
    pPVar11[2].tp_basicsize = (Py_ssize_t)hVar3.m_ptr;
    local_188.m_ptr = (PyObject *)0x0;
    pPVar11[2].tp_dealloc = (destructor)hVar4.m_ptr;
    local_128.m_ptr = (PyObject *)0x0;
    (pPVar11->ob_base).ob_base.ob_type = (PyTypeObject *)hVar5.m_ptr;
    pPVar11->tp_as_number = (PyNumberMethods *)&pPVar11[1].tp_basicsize;
    pPVar11->tp_as_sequence = (PySequenceMethods *)&pPVar11[1].tp_mro;
    pPVar11->tp_as_mapping = (PyMappingMethods *)&pPVar11[1].tp_free;
    pPVar11->tp_init = init;
    pPVar11->tp_new = new_instance;
    pPVar11->tp_dealloc = rec->dealloc;
    pPVar11->tp_weaklistoffset = 0x18;
    uVar2 = pPVar11->tp_flags;
    pPVar11->tp_flags = uVar2 & 0xffffffffffffb9ff | 0x600;
    if ((rec->field_0x48 & 2) != 0) {
      pPVar11->tp_flags = uVar2 | 0x4600;
      pPVar11->tp_dictoffset = pPVar11->tp_basicsize;
      pPVar11->tp_basicsize = pPVar11->tp_basicsize + 8;
      pPVar11->tp_getset = (PyGetSetDef *)generic_getset;
      pPVar11->tp_traverse = traverse;
      pPVar11->tp_clear = clear;
    }
    if ((rec->field_0x48 & 4) != 0) {
      pPVar11->tp_as_buffer = (PyBufferProcs *)&pPVar11[2].ob_base.ob_size;
      pPVar11[2].ob_base.ob_size = (Py_ssize_t)getbuffer;
      pPVar11[2].tp_name = (char *)releasebuffer;
    }
    pPVar11->tp_doc = __dest;
    (local_f8->super_object).super_handle.m_ptr = local_c8.m_ptr;
    iVar7 = PyType_Ready(pPVar11);
    if (iVar7 < 0) {
      std::__cxx11::string::string(local_50,rec->name,&local_151);
      plVar10 = (long *)std::__cxx11::string::append((char *)local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar10;
      psVar21 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar21) {
        local_90.field_2._M_allocated_capacity = *psVar21;
        local_90.field_2._8_8_ = plVar10[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar21;
      }
      local_90._M_string_length = plVar10[1];
      *plVar10 = (long)psVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      error_string_abi_cxx11_();
      std::operator+(&local_e8,&local_90,&local_70);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_150._0_8_ = *plVar10;
      pkVar20 = (key_type *)(plVar10 + 2);
      if ((key_type *)local_150._0_8_ == pkVar20) {
        local_140._0_8_ = *pkVar20;
        local_140._8_8_ = plVar10[3];
        local_150._0_8_ = local_140;
      }
      else {
        local_140._0_8_ = *pkVar20;
      }
      local_150._8_8_ = plVar10[1];
      *plVar10 = (long)pkVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pybind11_fail((string *)local_150);
    }
    if (local_180.m_ptr != (PyObject *)0x0) {
      local_150._8_8_ = (local_f8->super_object).super_handle.m_ptr;
      local_140._0_8_ = "__module__";
      local_140._8_8_ = (PyObject *)0x0;
      accessor_policies::str_attr::set((handle)local_150._8_8_,"__module__",local_180);
      object::~object((object *)(local_140 + 8));
    }
    pPVar19 = (rec->scope).m_ptr;
    if (pPVar19 != (PyObject *)0x0) {
      local_140._0_8_ = pPVar11[2].tp_basicsize;
      if ((PyObject *)local_140._0_8_ != (PyObject *)0x0) {
        ((PyObject *)local_140._0_8_)->ob_refcnt = ((PyObject *)local_140._0_8_)->ob_refcnt + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_140._8_8_ = (PyObject *)0x0;
      local_150._8_8_ = pPVar19;
      object::~object((object *)&local_e8);
      accessor_policies::obj_attr::set
                ((handle)local_150._8_8_,(handle)local_140._0_8_,
                 (local_f8->super_object).super_handle.m_ptr);
      object::~object((object *)(local_140 + 8));
      object::~object((object *)local_140);
    }
    if ((rec->field_0x48 & 1) != 0) {
      mark_parents_nonsimple(local_f8,pPVar11);
    }
    local_c8.m_ptr = (PyObject *)0x0;
    object::~object((object *)&local_c8);
    object::~object((object *)&local_130);
    object::~object((object *)&local_128);
    if ((PyObject *)local_178._0_8_ != (PyObject *)local_168) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_168._0_8_ + 1));
    }
    object::~object((object *)&local_120);
    object::~object((object *)&local_188);
    object::~object((object *)&local_f0);
    object::~object((object *)&local_180);
    object::~object((object *)&local_190);
    return;
  }
  std::__cxx11::string::string((string *)&local_e8,rec->name,(allocator *)&local_90);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_150._0_8_ = *plVar10;
  pkVar20 = (key_type *)(plVar10 + 2);
  if ((key_type *)local_150._0_8_ == pkVar20) {
    local_140._0_8_ = *pkVar20;
    local_140._8_8_ = plVar10[3];
    local_150._0_8_ = local_140;
  }
  else {
    local_140._0_8_ = *pkVar20;
  }
  local_150._8_8_ = plVar10[1];
  *plVar10 = (long)pkVar20;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  pybind11_fail((string *)local_150);
}

Assistant:

void initialize(type_record *rec) {
        auto &internals = get_internals();
        auto tindex = std::type_index(*(rec->type));

        if (get_type_info(*(rec->type)))
            pybind11_fail("generic_type: type \"" + std::string(rec->name) +
                          "\" is already registered!");

        auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec->name));
        object scope_module;
        if (rec->scope) {
            if (hasattr(rec->scope, rec->name))
                pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec->name) +
                        "\": an object with that name is already defined");

            if (hasattr(rec->scope, "__module__")) {
                scope_module = rec->scope.attr("__module__");
            } else if (hasattr(rec->scope, "__name__")) {
                scope_module = rec->scope.attr("__name__");
            }
        }

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        /* Qualified names for Python >= 3.3 */
        object scope_qualname;
        if (rec->scope && hasattr(rec->scope, "__qualname__"))
            scope_qualname = rec->scope.attr("__qualname__");
        object ht_qualname, ht_qualname_meta;
        if (scope_qualname)
            ht_qualname = reinterpret_steal<object>(PyUnicode_FromFormat(
                "%U.%U", scope_qualname.ptr(), name.ptr()));
        else
            ht_qualname = name;
        if (rec->metaclass)
            ht_qualname_meta = reinterpret_steal<object>(
                PyUnicode_FromFormat("%U__Meta", ht_qualname.ptr()));
#endif

#if !defined(PYPY_VERSION)
        std::string full_name = (scope_module ? ((std::string) pybind11::str(scope_module) + "." + rec->name)
                                              : std::string(rec->name));
#else
        std::string full_name = std::string(rec->name);
#endif

        /* Create a custom metaclass if requested (used for static properties) */
        object metaclass;
        if (rec->metaclass) {
            std::string meta_name_ = full_name + "__Meta";
            object meta_name = reinterpret_steal<object>(PYBIND11_FROM_STRING(meta_name_.c_str()));
            metaclass = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
            if (!metaclass || !name)
                pybind11_fail("generic_type::generic_type(): unable to create metaclass!");

            /* Danger zone: from now (and until PyType_Ready), make sure to
               issue no Python C API calls which could potentially invoke the
               garbage collector (the GC will call type_traverse(), which will in
               turn find the newly constructed type in an invalid state) */

            auto type = (PyHeapTypeObject*) metaclass.ptr();
            type->ht_name = meta_name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
            /* Qualified names for Python >= 3.3 */
            type->ht_qualname = ht_qualname_meta.release().ptr();
#endif
            type->ht_type.tp_name = strdup(meta_name_.c_str());
            type->ht_type.tp_base = &PyType_Type;
            type->ht_type.tp_flags |= (Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE) &
                                      ~Py_TPFLAGS_HAVE_GC;

            if (PyType_Ready(&type->ht_type) < 0)
                pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
        }

        size_t num_bases = rec->bases.size();
        auto bases = tuple(rec->bases);

        char *tp_doc = nullptr;
        if (rec->doc && options::show_user_defined_docstrings()) {
            /* Allocate memory for docstring (using PyObject_MALLOC, since
               Python will free this later on) */
            size_t size = strlen(rec->doc) + 1;
            tp_doc = (char *) PyObject_MALLOC(size);
            memcpy((void *) tp_doc, rec->doc, size);
        }

        /* Danger zone: from now (and until PyType_Ready), make sure to
           issue no Python C API calls which could potentially invoke the
           garbage collector (the GC will call type_traverse(), which will in
           turn find the newly constructed type in an invalid state) */

        auto type_holder = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
        auto type = (PyHeapTypeObject*) type_holder.ptr();

        if (!type_holder || !name)
            pybind11_fail(std::string(rec->name) + ": Unable to create type object!");

        /* Register supplemental type information in C++ dict */
        detail::type_info *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) type;
        tinfo->type_size = rec->type_size;
        tinfo->init_holder = rec->init_holder;
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[type] = tinfo;

        /* Basic type attributes */
        type->ht_type.tp_name = strdup(full_name.c_str());
        type->ht_type.tp_basicsize = (ssize_t) rec->instance_size;

        if (num_bases > 0) {
            type->ht_type.tp_base = (PyTypeObject *) ((object) bases[0]).inc_ref().ptr();
            type->ht_type.tp_bases = bases.release().ptr();
            rec->multiple_inheritance |= num_bases > 1;
        }

        type->ht_name = name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        type->ht_qualname = ht_qualname.release().ptr();
#endif

        /* Metaclass */
        PYBIND11_OB_TYPE(type->ht_type) = (PyTypeObject *) metaclass.release().ptr();

        /* Supported protocols */
        type->ht_type.tp_as_number = &type->as_number;
        type->ht_type.tp_as_sequence = &type->as_sequence;
        type->ht_type.tp_as_mapping = &type->as_mapping;

        /* Supported elementary operations */
        type->ht_type.tp_init = (initproc) init;
        type->ht_type.tp_new = (newfunc) new_instance;
        type->ht_type.tp_dealloc = rec->dealloc;

        /* Support weak references (needed for the keep_alive feature) */
        type->ht_type.tp_weaklistoffset = offsetof(instance_essentials<void>, weakrefs);

        /* Flags */
        type->ht_type.tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
        type->ht_type.tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif
        type->ht_type.tp_flags &= ~Py_TPFLAGS_HAVE_GC;

        /* Support dynamic attributes */
        if (rec->dynamic_attr) {
            #if defined(PYPY_VERSION)
                pybind11_fail(std::string(rec->name) + ": dynamic attributes are "
                                                       "currently not supported in "
                                                       "conunction with PyPy!");
            #endif
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_GC;
            type->ht_type.tp_dictoffset = type->ht_type.tp_basicsize; // place the dict at the end
            type->ht_type.tp_basicsize += sizeof(PyObject *); // and allocate enough space for it
            type->ht_type.tp_getset = generic_getset;
            type->ht_type.tp_traverse = traverse;
            type->ht_type.tp_clear = clear;
        }

        if (rec->buffer_protocol) {
            type->ht_type.tp_as_buffer = &type->as_buffer;
#if PY_MAJOR_VERSION < 3
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_NEWBUFFER;
#endif
            type->as_buffer.bf_getbuffer = getbuffer;
            type->as_buffer.bf_releasebuffer = releasebuffer;
        }

        type->ht_type.tp_doc = tp_doc;

        m_ptr = type_holder.ptr();

        if (PyType_Ready(&type->ht_type) < 0)
            pybind11_fail(std::string(rec->name) + ": PyType_Ready failed (" +
                          detail::error_string() + ")!");

        if (scope_module) // Needed by pydoc
            attr("__module__") = scope_module;

        /* Register type with the parent scope */
        if (rec->scope)
            rec->scope.attr(handle(type->ht_name)) = *this;

        if (rec->multiple_inheritance)
            mark_parents_nonsimple(&type->ht_type);

        type_holder.release();
    }